

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O2

DecodeStatus DecodeT2LoadShift(MCInst *Inst,uint Insn,uint64_t Address,void *Decoder)

{
  uint uVar1;
  DecodeStatus DVar2;
  DecodeStatus DVar3;
  uint64_t uVar4;
  uint64_t Address_00;
  uint64_t extraout_RDX;
  uint64_t uVar5;
  uint64_t Address_01;
  uint uVar6;
  uint RegNo;
  
  uVar6 = Insn >> 0x10 & 0xf;
  uVar4 = ARM_getFeatureBits(Inst->csh->mode);
  if (uVar6 == 0xf) {
    uVar6 = MCInst_getOpcode(Inst);
    if (uVar6 == 0x951) {
      uVar6 = 0x94f;
    }
    else if (uVar6 == 0x9be) {
      uVar6 = 0x9bd;
    }
    else if (uVar6 == 0x968) {
      uVar6 = 0x966;
    }
    else if (uVar6 == 0x970) {
      uVar6 = 0x96e;
    }
    else if (uVar6 == 0x979) {
      uVar6 = 0x976;
    }
    else if (uVar6 == 0x9ba) {
      uVar6 = 0x9b9;
    }
    else {
      if (uVar6 != 0x960) {
        return MCDisassembler_Fail;
      }
      uVar6 = 0x95e;
    }
    MCInst_setOpcode(Inst,uVar6);
    DVar3 = DecodeT2LoadLabel(Inst,Insn,Address_01,Decoder);
    return DVar3;
  }
  RegNo = Insn >> 0xc & 0xf;
  if (RegNo == 0xf) {
    uVar1 = MCInst_getOpcode(Inst);
    if (uVar1 == 0x960) {
      uVar1 = 0x9b6;
    }
    else {
      if (uVar1 == 0x970) {
        return MCDisassembler_Fail;
      }
      if (uVar1 != 0x968) goto LAB_001d0926;
      uVar1 = 0x9be;
    }
    MCInst_setOpcode(Inst,uVar1);
  }
LAB_001d0926:
  uVar1 = MCInst_getOpcode(Inst);
  DVar3 = MCDisassembler_Success;
  uVar5 = Address_00;
  if (uVar1 == 0x9b6) {
    if ((~uVar4 & 0x10000008000) != 0) {
      return MCDisassembler_Fail;
    }
  }
  else if (uVar1 != 0x9ba) {
    if (uVar1 == 0x9be) {
      if ((uVar4 & 0x10000000000) == 0) {
        return MCDisassembler_Fail;
      }
    }
    else {
      DVar3 = DecodeGPRRegisterClass(Inst,RegNo,Address_00,Decoder);
      uVar5 = extraout_RDX;
      if ((DVar3 | 2) != MCDisassembler_Success) {
        return MCDisassembler_Fail;
      }
    }
  }
  DVar2 = DecodeT2AddrModeSOReg(Inst,uVar6 << 6 | (Insn >> 4 & 3) + (Insn & 0xf) * 4,uVar5,Decoder);
  if (DVar2 == MCDisassembler_Fail) {
    return MCDisassembler_Fail;
  }
  if (DVar2 == MCDisassembler_Success) {
    return DVar3;
  }
  if (DVar2 != MCDisassembler_SoftFail) {
    return MCDisassembler_Fail;
  }
  return MCDisassembler_SoftFail;
}

Assistant:

static DecodeStatus DecodeT2LoadShift(MCInst *Inst, unsigned Insn,
		uint64_t Address, const void *Decoder)
{
	DecodeStatus S = MCDisassembler_Success;
	unsigned addrmode;
	unsigned Rt = fieldFromInstruction_4(Insn, 12, 4);
	unsigned Rn = fieldFromInstruction_4(Insn, 16, 4);
	uint64_t featureBits = ARM_getFeatureBits(Inst->csh->mode);
	bool hasMP = ((featureBits & ARM_FeatureMP) != 0);
	bool hasV7Ops = ((featureBits & ARM_HasV7Ops) != 0);

	if (Rn == 15) {
		switch (MCInst_getOpcode(Inst)) {
			case ARM_t2LDRBs:
				MCInst_setOpcode(Inst, ARM_t2LDRBpci);
				break;
			case ARM_t2LDRHs:
				MCInst_setOpcode(Inst, ARM_t2LDRHpci);
				break;
			case ARM_t2LDRSHs:
				MCInst_setOpcode(Inst, ARM_t2LDRSHpci);
				break;
			case ARM_t2LDRSBs:
				MCInst_setOpcode(Inst, ARM_t2LDRSBpci);
				break;
			case ARM_t2LDRs:
				MCInst_setOpcode(Inst, ARM_t2LDRpci);
				break;
			case ARM_t2PLDs:
				MCInst_setOpcode(Inst, ARM_t2PLDpci);
				break;
			case ARM_t2PLIs:
				MCInst_setOpcode(Inst, ARM_t2PLIpci);
				break;
			default:
				return MCDisassembler_Fail;
		}

		return DecodeT2LoadLabel(Inst, Insn, Address, Decoder);
	}

	if (Rt == 15) {
		switch (MCInst_getOpcode(Inst)) {
			case ARM_t2LDRSHs:
				return MCDisassembler_Fail;
			case ARM_t2LDRHs:
				MCInst_setOpcode(Inst, ARM_t2PLDWs);
				break;
			case ARM_t2LDRSBs:
				MCInst_setOpcode(Inst, ARM_t2PLIs);
			default:
				break;
		}
	}

	switch (MCInst_getOpcode(Inst)) {
		case ARM_t2PLDs:
			break;
		case ARM_t2PLIs:
			if (!hasV7Ops)
				return MCDisassembler_Fail;
			break;
		case ARM_t2PLDWs:
			if (!hasV7Ops || !hasMP)
				return MCDisassembler_Fail;
			break;
		default:
			if (!Check(&S, DecodeGPRRegisterClass(Inst, Rt, Address, Decoder)))
				return MCDisassembler_Fail;
	}

	addrmode = fieldFromInstruction_4(Insn, 4, 2);
	addrmode |= fieldFromInstruction_4(Insn, 0, 4) << 2;
	addrmode |= fieldFromInstruction_4(Insn, 16, 4) << 6;
	if (!Check(&S, DecodeT2AddrModeSOReg(Inst, addrmode, Address, Decoder)))
		return MCDisassembler_Fail;

	return S;
}